

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

wchar_t archive_acl_from_text_w(archive_acl *acl,wchar_t *text,wchar_t want_type)

{
  int *piVar1;
  anon_struct_16_2_267fbce2 *paVar2;
  int iVar3;
  int iVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t *p;
  ulong uVar7;
  long lVar8;
  int *piVar9;
  anon_struct_16_2_267fbce2 *paVar10;
  ulong uVar11;
  wchar_t *pwVar12;
  uint uVar13;
  wchar_t *pwVar14;
  uint uVar15;
  wchar_t type;
  ulong uVar16;
  wchar_t *pwVar17;
  ulong uVar18;
  uint uVar19;
  wchar_t wVar20;
  ulong uVar21;
  size_t sStackY_f0;
  wchar_t local_dc;
  wchar_t id;
  wchar_t local_d4;
  wchar_t *local_d0;
  wchar_t local_c4;
  wchar_t local_c0;
  wchar_t local_bc;
  wchar_t *local_b8;
  wchar_t *local_b0;
  wchar_t local_a4;
  archive_acl *local_a0;
  anon_struct_16_2_267fbce2 field [6];
  
  uVar21 = 5;
  local_c0 = want_type;
  if ((want_type != L'Ā') && (want_type != L'Ȁ')) {
    if (want_type == L'㰀') {
      uVar21 = 6;
    }
    else {
      if (want_type != L'̀') {
        return L'\xffffffe2';
      }
      local_c0 = L'Ā';
    }
  }
  local_a4 = L'\0';
  local_a0 = acl;
  wVar6 = L'\0';
switchD_004785d5_caseD_7:
  do {
    do {
      local_bc = wVar6;
      if ((text == (wchar_t *)0x0) || (*text == L'\0')) {
        archive_acl_reset(local_a0,local_a4);
        return local_bc;
      }
      uVar16 = 0;
      uVar11 = 1;
      paVar2 = field + 1;
      do {
        while ((paVar10 = paVar2, uVar7 = uVar11, uVar18 = uVar16, uVar16 = (ulong)(uint)*text,
               pwVar12 = text, uVar16 < 0x21 && ((0x100000600U >> (uVar16 & 0x3f) & 1) != 0))) {
          text = text + 1;
          uVar16 = uVar18;
          uVar11 = uVar7;
          paVar2 = paVar10;
        }
        while ((uVar15 = (uint)uVar16, 0x3a < uVar15 ||
               (pwVar14 = pwVar12, (0x400100000000401U >> (uVar16 & 0x3f) & 1) == 0))) {
          uVar16 = (ulong)(uint)pwVar12[1];
          pwVar12 = pwVar12 + 1;
        }
        do {
          pwVar17 = pwVar14;
          if (0x20 < (ulong)(uint)pwVar17[-1]) break;
          pwVar14 = pwVar17 + -1;
        } while ((0x100000600U >> ((ulong)(uint)pwVar17[-1] & 0x3f) & 1) != 0);
        if (uVar18 < uVar21) {
          field[uVar18].start = text;
          field[uVar18].end = pwVar17;
        }
        pwVar14 = field[0].start;
        text = pwVar12 + (uVar15 != 0);
        uVar16 = uVar18 + 1;
        uVar11 = uVar7 + 1;
        paVar2 = paVar10 + 1;
      } while (uVar15 == 0x3a);
      text = pwVar12 + (uVar15 != 0);
      for (; uVar7 < uVar21; uVar7 = uVar7 + 1) {
        paVar10->start = (wchar_t *)0x0;
        paVar10->end = (wchar_t *)0x0;
        paVar10 = paVar10 + 1;
      }
    } while ((field[0].start != (wchar_t *)0x0) && (wVar6 = local_bc, *field[0].start == L'#'));
    id = L'\xffffffff';
    local_d4 = L'\0';
    uVar16 = (long)field[0].end - (long)field[0].start;
    if (local_c0 == L'㰀') goto code_r0x004785af;
    uVar11 = 0;
    if (*field[0].start == L'd') {
      local_c4 = L'Ȁ';
      if (uVar16 == 4) {
LAB_0047861a:
        uVar11 = 1;
      }
      else {
        if (uVar16 < 0x19) goto LAB_00478653;
        local_d0 = field[0].start;
        iVar3 = wmemcmp(field[0].start + 1,anon_var_dwarf_c5b8aa,6);
        if (iVar3 == 0) {
          uVar11 = 0;
          if (uVar16 == 0x1c) goto LAB_0047861a;
          field[0].start = local_d0 + 7;
        }
        else {
          local_c4 = local_c0;
          uVar11 = 0;
        }
      }
    }
    else {
LAB_00478653:
      local_c4 = local_c0;
    }
    uVar15 = (int)uVar11 + 1;
    uVar16 = (ulong)(uVar15 * 0x10);
    local_b0 = *(wchar_t **)((long)&field[0].start + uVar16);
    local_b8 = *(wchar_t **)((long)&field[0].end + uVar16);
    local_d0 = (wchar_t *)uVar11;
    isint_w(local_b0,local_b8,&id);
    iVar3 = (int)local_d0;
    uVar19 = (uint)uVar18;
    if ((id == L'\xffffffff') && (iVar3 + 3U <= uVar19)) {
      uVar16 = (ulong)((iVar3 + 3U) * 0x10);
      isint_w(*(wchar_t **)((long)&field[0].start + uVar16),
              *(wchar_t **)((long)&field[0].end + uVar16),&id);
      iVar3 = (int)local_d0;
    }
    piVar9 = *(int **)((long)&field[0].start + (ulong)(uint)(iVar3 << 4));
    uVar13 = *piVar9 - 0x67U >> 1 | (uint)((*piVar9 - 0x67U & 1) != 0) << 0x1f;
    wVar6 = L'\xffffffec';
  } while (7 < uVar13);
  lVar8 = *(long *)((long)&field[0].end + (ulong)(uint)(iVar3 << 4)) - (long)piVar9;
  wVar6 = L'\xffffffec';
  switch(uVar13) {
  case 0:
    wVar20 = L'✔';
    local_dc = L'✓';
    if (lVar8 != 4) {
      wVar6 = L'\xffffffec';
      if (lVar8 != 0x14) goto switchD_004785d5_caseD_7;
      piVar1 = anon_var_dwarf_c5b910;
      sStackY_f0 = 4;
      wVar20 = L'✔';
LAB_00478817:
      iVar4 = wmemcmp(piVar9 + 1,piVar1 + 1,sStackY_f0);
      iVar3 = (int)local_d0;
      wVar6 = L'\xffffffec';
      if (iVar4 != 0) goto switchD_004785d5_caseD_7;
    }
    break;
  default:
    goto switchD_004785d5_caseD_7;
  case 3:
    local_dc = L'✕';
    if (lVar8 == 4) goto LAB_004788ed;
    wVar6 = L'\xffffffec';
    if (lVar8 != 0x10) goto switchD_004785d5_caseD_7;
    piVar1 = anon_var_dwarf_c5ba4a;
    sStackY_f0 = 3;
LAB_004788d0:
    iVar4 = wmemcmp(piVar9 + 1,piVar1 + 1,sStackY_f0);
    iVar3 = (int)local_d0;
    wVar6 = L'\xffffffec';
    if (iVar4 != 0) goto switchD_004785d5_caseD_7;
    goto LAB_004788ed;
  case 4:
    local_dc = L'✖';
    if (lVar8 != 4) {
      wVar6 = L'\xffffffec';
      if (lVar8 == 0x14) {
        piVar1 = anon_var_dwarf_c5ba55;
        sStackY_f0 = 4;
        goto LAB_004788d0;
      }
      goto switchD_004785d5_caseD_7;
    }
LAB_004788ed:
    pwVar12 = local_b0;
    if (local_b8 <= local_b0 || uVar15 != uVar19) {
LAB_00478933:
      wVar6 = L'\xffffffec';
      if (iVar3 + 2U != uVar19 || local_b8 <= pwVar12) {
        iVar4 = 0;
        pwVar12 = (wchar_t *)0x0;
        pwVar14 = (wchar_t *)0x0;
        goto LAB_0047895c;
      }
      goto switchD_004785d5_caseD_7;
    }
    wVar6 = ismode_w(local_b0,local_b8,&local_d4);
    iVar3 = (int)local_d0;
    if (wVar6 == L'\0') goto LAB_00478933;
    iVar4 = -1;
    pwVar12 = (wchar_t *)0x0;
    pwVar14 = (wchar_t *)0x0;
    goto LAB_0047895c;
  case 7:
    wVar20 = L'✒';
    local_dc = L'✑';
    if (lVar8 != 4) {
      wVar6 = L'\xffffffec';
      if (lVar8 == 0x10) {
        piVar1 = anon_var_dwarf_c5b905;
        sStackY_f0 = 3;
        wVar20 = L'✒';
        goto LAB_00478817;
      }
      goto switchD_004785d5_caseD_7;
    }
  }
  iVar4 = 0;
  pwVar12 = local_b8;
  pwVar14 = local_b0;
  if ((local_b8 <= local_b0) && (id == L'\xffffffff')) {
    pwVar12 = (wchar_t *)0x0;
    pwVar14 = (wchar_t *)0x0;
    local_dc = wVar20;
  }
LAB_0047895c:
  wVar20 = local_d4;
  type = local_c4;
  if (local_d4 != L'\0') goto LAB_00478c43;
  uVar15 = iVar4 + iVar3 + 2;
  local_b0 = pwVar14;
  wVar5 = ismode_w(field[uVar15].start,field[uVar15].end,&local_d4);
  pwVar14 = local_b0;
  wVar20 = local_d4;
  type = local_c4;
  wVar6 = L'\xffffffec';
  if (wVar5 == L'\0') goto switchD_004785d5_caseD_7;
LAB_00478c43:
  wVar6 = archive_acl_add_entry_w_len
                    (local_a0,type,wVar20,local_dc,id,pwVar14,(long)pwVar12 - (long)pwVar14 >> 2);
  if (wVar6 < L'\xffffffec') {
    return wVar6;
  }
  if (wVar6 != L'\0') {
    local_bc = L'\xffffffec';
  }
  local_a4 = local_a4 | type;
  wVar6 = local_bc;
  goto switchD_004785d5_caseD_7;
code_r0x004785af:
  wVar6 = L'\xffffffec';
  switch((long)uVar16 >> 2) {
  case 4:
    iVar3 = wmemcmp(field[0].start,anon_var_dwarf_c5b905,4);
    wVar6 = L'\xffffffec';
    if (iVar3 != 0) goto switchD_004785d5_caseD_7;
    local_dc = L'✑';
    goto LAB_00478885;
  case 5:
    iVar3 = wmemcmp(field[0].start,anon_var_dwarf_c5b910,5);
    wVar6 = L'\xffffffec';
    if (iVar3 != 0) goto switchD_004785d5_caseD_7;
    local_dc = L'✓';
LAB_00478885:
    pwVar12 = field[1].start;
    local_b8 = field[1].end;
    isint_w(field[1].start,field[1].end,&id);
    iVar3 = 1;
    break;
  case 6:
    iVar3 = wmemcmp(field[0].start,anon_var_dwarf_c5b927,6);
    if (iVar3 != 0) {
      iVar3 = wmemcmp(pwVar14,anon_var_dwarf_c5b932,6);
      wVar6 = L'\xffffffec';
      if (iVar3 != 0) goto switchD_004785d5_caseD_7;
      local_dc = L'✔';
      goto LAB_004787e4;
    }
    local_b8 = (wchar_t *)0x0;
    local_dc = L'✒';
    pwVar12 = (wchar_t *)0x0;
    iVar3 = 0;
    break;
  default:
    goto switchD_004785d5_caseD_7;
  case 9:
    iVar3 = wmemcmp(field[0].start,anon_var_dwarf_c5b93d,9);
    wVar6 = L'\xffffffec';
    if (iVar3 != 0) goto switchD_004785d5_caseD_7;
    local_dc = L'❻';
LAB_004787e4:
    local_b8 = (wchar_t *)0x0;
    pwVar12 = (wchar_t *)0x0;
    iVar3 = 0;
  }
  pwVar14 = (wchar_t *)(ulong)(uint)(iVar3 << 4);
  piVar9 = *(int **)((long)&field[1].start + (long)pwVar14);
  wVar20 = L'\0';
LAB_004789fd:
  if (*(int **)((long)&field[1].end + (long)pwVar14) <= piVar9) goto LAB_00478aa6;
  iVar3 = *piVar9;
  piVar9 = piVar9 + 1;
  uVar15 = 8;
  switch(iVar3) {
  case 0x6f:
    uVar15 = 0x4000;
    break;
  case 0x70:
    uVar15 = 0x20;
    break;
  case 0x71:
  case 0x74:
  case 0x75:
  case 0x76:
    goto switchD_00478a55_caseD_71;
  case 0x72:
    break;
  case 0x73:
    uVar15 = 0x8000;
    break;
  case 0x77:
    uVar15 = 0x10;
    break;
  case 0x78:
    uVar15 = 1;
    break;
  default:
    goto switchD_00478a55_default;
  }
switchD_00478a55_caseD_72:
  wVar20 = wVar20 | uVar15;
  goto LAB_004789fd;
LAB_00478aa6:
  piVar9 = *(int **)((long)&field[2].start + (long)pwVar14);
  while (piVar9 < *(int **)((long)&field[2].end + (long)pwVar14)) {
    iVar3 = *piVar9;
    piVar9 = piVar9 + 1;
    if (iVar3 != 0x2d) {
      if (iVar3 == 0x46) {
        uVar15 = 0x40000000;
      }
      else if (iVar3 == 0x49) {
        uVar15 = 0x1000000;
      }
      else if (iVar3 == 0x53) {
        uVar15 = 0x20000000;
      }
      else if (iVar3 == 0x6e) {
        uVar15 = 0x8000000;
      }
      else if (iVar3 == 0x66) {
        uVar15 = 0x2000000;
      }
      else if (iVar3 == 0x69) {
        uVar15 = 0x10000000;
      }
      else {
        if (iVar3 != 100) goto switchD_00478a55_caseD_71;
        uVar15 = 0x4000000;
      }
      wVar20 = wVar20 | uVar15;
    }
  }
  pwVar17 = *(wchar_t **)((long)&field[3].start + (long)pwVar14);
  lVar8 = *(long *)((long)&field[3].end + (long)pwVar14) - (long)pwVar17;
  local_d4 = wVar20;
  local_b0 = pwVar12;
  if (lVar8 == 0x14) {
    local_d0 = pwVar14;
    iVar3 = wmemcmp(pwVar17,anon_var_dwarf_c5b95f,5);
    if (iVar3 == 0) {
      type = L'Ѐ';
      pwVar14 = local_d0;
    }
    else {
      iVar3 = wmemcmp(pwVar17,anon_var_dwarf_c5b96a,5);
      if (iVar3 == 0) {
        type = L'က';
        pwVar14 = local_d0;
      }
      else {
        iVar3 = wmemcmp(pwVar17,anon_var_dwarf_c5b975,5);
        wVar6 = L'\xffffffec';
        if (iVar3 != 0) goto switchD_004785d5_caseD_7;
        type = L'\x2000';
        pwVar14 = local_d0;
      }
    }
  }
  else {
    wVar6 = L'\xffffffec';
    if (lVar8 != 0x10) goto switchD_004785d5_caseD_7;
    iVar3 = wmemcmp(pwVar17,anon_var_dwarf_c5b954,4);
    wVar6 = L'\xffffffec';
    if (iVar3 != 0) goto switchD_004785d5_caseD_7;
    type = L'ࠀ';
  }
  isint_w(*(wchar_t **)((long)&field[4].start + (long)pwVar14),
          *(wchar_t **)((long)&field[4].end + (long)pwVar14),&id);
  pwVar12 = local_b8;
  pwVar14 = local_b0;
  goto LAB_00478c43;
switchD_00478a55_default:
  if (iVar3 == 0x2d) goto LAB_004789fd;
  if (iVar3 == 0x41) {
    uVar15 = 0x400;
  }
  else if (iVar3 == 0x43) {
    uVar15 = 0x2000;
  }
  else if (iVar3 == 0x44) {
    uVar15 = 0x100;
  }
  else if (iVar3 == 0x52) {
    uVar15 = 0x40;
  }
  else if (iVar3 == 0x57) {
    uVar15 = 0x80;
  }
  else if (iVar3 == 0x61) {
    uVar15 = 0x200;
  }
  else if (iVar3 == 99) {
    uVar15 = 0x1000;
  }
  else {
    if (iVar3 != 100) goto switchD_00478a55_caseD_71;
    uVar15 = 0x800;
  }
  goto switchD_00478a55_caseD_72;
switchD_00478a55_caseD_71:
  local_d4 = wVar20;
  wVar6 = L'\xffffffec';
  goto switchD_004785d5_caseD_7;
}

Assistant:

int
archive_acl_from_text_w(struct archive_acl *acl, const wchar_t *text,
    int want_type)
{
	struct {
		const wchar_t *start;
		const wchar_t *end;
	} field[6], name;

	const wchar_t *s, *st;

	int numfields, fields, n, r, sol, ret;
	int type, types, tag, permset, id;
	size_t len;
	wchar_t sep;

	ret = ARCHIVE_OK;
	types = 0;

	switch (want_type) {
	case ARCHIVE_ENTRY_ACL_TYPE_POSIX1E:
		want_type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
	case ARCHIVE_ENTRY_ACL_TYPE_ACCESS:
	case ARCHIVE_ENTRY_ACL_TYPE_DEFAULT:
		numfields = 5;
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_NFS4:
		numfields = 6;
		break;
	default:
		return (ARCHIVE_FATAL);
	}

	while (text != NULL && *text != L'\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const wchar_t *start, *end;
			next_field_w(&text, &start, &end, &sep);
			if (fields < numfields) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == L':');

		/* Set remaining fields to blank. */
		for (n = fields; n < numfields; ++n)
			field[n].start = field[n].end = NULL;

		if (field[0].start != NULL && *(field[0].start) == L'#') {
			/* Comment, skip entry */
			continue;
		}

		n = 0;
		sol = 0;
		id = -1;
		permset = 0;
		name.start = name.end = NULL;

		if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* POSIX.1e ACLs */
			/*
			 * Default keyword "default:user::rwx"
			 * if found, we have one more field
			 *
			 * We also support old Solaris extension:
			 * "defaultuser::rwx" is the default ACL corresponding
			 * to "user::rwx", etc. valid only for first field
			 */
			s = field[0].start;
			len = field[0].end - field[0].start;
			if (*s == L'd' && (len == 1 || (len >= 7
			    && wmemcmp((s + 1), L"efault", 6) == 0))) {
				type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
				if (len > 7)
					field[0].start += 7;
				else
					n = 1;
			} else
				type = want_type;

			/* Check for a numeric ID in field n+1 or n+3. */
			isint_w(field[n + 1].start, field[n + 1].end, &id);
			/* Field n+3 is optional. */
			if (id == -1 && fields > n+3)
				isint_w(field[n + 3].start, field[n + 3].end,
				    &id);

			tag = 0;
			s = field[n].start;
			st = field[n].start + 1;
			len = field[n].end - field[n].start;

			switch (*s) {
			case L'u':
				if (len == 1 || (len == 4
				    && wmemcmp(st, L"ser", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				break;
			case L'g':
				if (len == 1 || (len == 5
				    && wmemcmp(st, L"roup", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case L'o':
				if (len == 1 || (len == 5
				    && wmemcmp(st, L"ther", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_OTHER;
				break;
			case L'm':
				if (len == 1 || (len == 4
				    && wmemcmp(st, L"ask", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_MASK;
				break;
			default:
					break;
			}

			switch (tag) {
			case ARCHIVE_ENTRY_ACL_OTHER:
			case ARCHIVE_ENTRY_ACL_MASK:
				if (fields == (n + 2)
				    && field[n + 1].start < field[n + 1].end
				    && ismode_w(field[n + 1].start,
				    field[n + 1].end, &permset)) {
					/* This is Solaris-style "other:rwx" */
					sol = 1;
				} else if (fields == (n + 3) &&
				    field[n + 1].start < field[n + 1].end) {
					/* Invalid mask or other field */
					ret = ARCHIVE_WARN;
					continue;
				}
				break;
			case ARCHIVE_ENTRY_ACL_USER_OBJ:
			case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
				if (id != -1 ||
				    field[n + 1].start < field[n + 1].end) {
					name = field[n + 1];
					if (tag == ARCHIVE_ENTRY_ACL_USER_OBJ)
						tag = ARCHIVE_ENTRY_ACL_USER;
					else
						tag = ARCHIVE_ENTRY_ACL_GROUP;
				}
				break;
			default:
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}

			/*
			 * Without "default:" we expect mode in field 2
			 * Exception: Solaris other and mask fields
			 */
			if (permset == 0 && !ismode_w(field[n + 2 - sol].start,
			    field[n + 2 - sol].end, &permset)) {
				/* Invalid mode, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
		} else {
			/* NFS4 ACLs */
			s = field[0].start;
			len = field[0].end - field[0].start;
			tag = 0;

			switch (len) {
			case 4:
				if (wmemcmp(s, L"user", 4) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER;
				break;
			case 5:
				if (wmemcmp(s, L"group", 5) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP;
				break;
			case 6:
				if (wmemcmp(s, L"owner@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				else if (wmemcmp(s, L"group@", len) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 9:
				if (wmemcmp(s, L"everyone@", 9) == 0)
					tag = ARCHIVE_ENTRY_ACL_EVERYONE;
			default:
				break;
			}

			if (tag == 0) {
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			} else if (tag == ARCHIVE_ENTRY_ACL_USER ||
			    tag == ARCHIVE_ENTRY_ACL_GROUP) {
				n = 1;
				name = field[1];
				isint_w(name.start, name.end, &id);
			} else
				n = 0;

			if (!is_nfs4_perms_w(field[1 + n].start,
			    field[1 + n].end, &permset)) {
				/* Invalid NFSv4 perms, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			if (!is_nfs4_flags_w(field[2 + n].start,
			    field[2 + n].end, &permset)) {
				/* Invalid NFSv4 flags, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			s = field[3 + n].start;
			len = field[3 + n].end - field[3 + n].start;
			type = 0;
			if (len == 4) {
				if (wmemcmp(s, L"deny", 4) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_DENY;
			} else if (len == 5) {
				if (wmemcmp(s, L"allow", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALLOW;
				else if (wmemcmp(s, L"audit", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_AUDIT;
				else if (wmemcmp(s, L"alarm", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALARM;
			}
			if (type == 0) {
				/* Invalid entry type, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			isint_w(field[4 + n].start, field[4 + n].end, &id);
		}

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_w_len(acl, type, permset,
		    tag, id, name.start, name.end - name.start);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
		types |= type;
	}

	/* Reset ACL */
	archive_acl_reset(acl, types);

	return (ret);
}